

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

ON_NurbsCurve * ReadV1_RHINOIO_NURBS_CURVE_OBJECT_DATA(ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  ON_NurbsCurve *this;
  double *p;
  int i;
  int cv_count;
  int order;
  int is_rat;
  int dim;
  int version;
  ON__UINT32 tcode;
  int flag;
  ON__INT64 big_value;
  int local_44;
  int local_40;
  uint local_3c;
  int local_38;
  uint local_34;
  uint local_30;
  int local_2c;
  ON__INT64 local_28;
  
  local_30 = 0;
  local_28 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_30,&local_28);
  if (bVar1) {
    if (((((local_30 == 0x2fffe) &&
          (bVar1 = ON_BinaryArchive::ReadInt32(file,1,(ON__INT32 *)&local_34), bVar1)) &&
         (local_34 = local_34 & 0xfffffeff, 0xfffffffd < local_34 - 0x66)) &&
        ((ON_BinaryArchive::ReadInt32(file,1,&local_38), 0 < local_38 &&
         (ON_BinaryArchive::ReadInt32(file,1,(ON__INT32 *)&local_3c), local_3c < 2)))) &&
       ((ON_BinaryArchive::ReadInt32(file,1,&local_40), 1 < local_40 &&
        ((ON_BinaryArchive::ReadInt32(file,1,&local_44), local_40 <= local_44 &&
         (ON_BinaryArchive::ReadInt32(file,1,&local_2c), local_2c == 0)))))) {
      this = (ON_NurbsCurve *)operator_new(0x40);
      ON_NurbsCurve::ON_NurbsCurve(this,local_38,local_3c != 0,local_40,local_44);
      bVar2 = ON_BinaryArchive::ReadDouble(file,(long)(local_40 + local_44 + -2),this->m_knot);
      bVar1 = false;
      i = 0;
      if (bVar2) {
        if (0 < local_44) {
          i = 0;
          do {
            p = ON_NurbsCurve::CV(this,i);
            bVar1 = ON_BinaryArchive::ReadDouble
                              (file,((long)local_38 + 1) - (ulong)(local_3c == 0),p);
            if (!bVar1) break;
            i = i + 1;
          } while (i < local_44);
        }
        bVar1 = local_44 <= i;
      }
    }
    else {
      bVar1 = false;
      this = (ON_NurbsCurve *)0x0;
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(file,false);
    if (this == (ON_NurbsCurve *)0x0) {
      return (ON_NurbsCurve *)0x0;
    }
    if ((bVar2 & bVar1) != 0) {
      return this;
    }
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this);
  }
  return (ON_NurbsCurve *)0x0;
}

Assistant:

static
ON_NurbsCurve* ReadV1_RHINOIO_NURBS_CURVE_OBJECT_DATA( ON_BinaryArchive& file )
{
  // read TCODE_RHINOIO_OBJECT_DATA chunk that is contained in a
  // TCODE_RHINOIO_OBJECT_NURBS_CURVE chunk.  The TCODE_RHINOIO_OBJECT_DATA
  // chunk contains the definition of NURBS curves written by the 
  // old RhinoIO toolkit.
  ON_NurbsCurve* curve = 0;
  bool rc = false;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  int version, dim, is_rat, order, cv_count, flag, i;
  if ( !file.BeginRead3dmBigChunk( &tcode, &big_value ) )
    return nullptr;
  if ( tcode == TCODE_RHINOIO_OBJECT_DATA ) for (;;) {
    if ( !file.ReadInt(&version) )
      break;
    // int bReverse = version & 0x100;
    version &= 0xFFFFFEFF;
    if ( version != 100 && version != 101 )
      break;
    file.ReadInt(&dim);
    if ( dim < 1 )
      break;
    file.ReadInt(&is_rat);
    if ( is_rat < 0 || is_rat > 1 )
      break;
    file.ReadInt(&order);
    if ( order < 2 )
      break;
    file.ReadInt(&cv_count);
    if ( cv_count < order )
      break;
    file.ReadInt(&flag);
    if ( flag != 0 )
      break;

    curve = new ON_NurbsCurve(dim,is_rat,order,cv_count);
    if ( !file.ReadDouble( order+cv_count-2, curve->m_knot ) )
      break;
    int cvdim = is_rat ? dim+1 : dim;
    for ( i = 0; i < cv_count; i++ ) {
      if ( !file.ReadDouble( cvdim, curve->CV(i) ) )
        break;
    }
    if ( i < cv_count )
      break;
    rc = true;
    break;
  }
  if ( !file.EndRead3dmChunk() ) // end of TCODE_RHINOIO_OBJECT_DATA chunk
    rc = false;
  if ( !rc && curve ) {
    delete curve;
    curve = 0;
  }

  return curve;
}